

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionAllocator.hpp
# Opt level: O0

void __thiscall
RegionDetector::RegionAllocator<RegionDetector::Region>::addChunk
          (RegionAllocator<RegionDetector::Region> *this)

{
  size_type __n;
  allocator<RegionDetector::Region> local_29;
  vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_> local_28;
  RegionAllocator<RegionDetector::Region> *local_10;
  RegionAllocator<RegionDetector::Region> *this_local;
  
  __n = this->chunkSize;
  local_10 = this;
  std::allocator<RegionDetector::Region>::allocator(&local_29);
  std::vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_>::vector
            (&local_28,__n,&local_29);
  std::
  vector<std::vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_>,_std::allocator<std::vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_>_>_>
  ::push_back(&this->pool,&local_28);
  std::vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_>::~vector(&local_28);
  std::allocator<RegionDetector::Region>::~allocator(&local_29);
  this->chunkPos = this->chunkPos + 1;
  this->regionPos = 0;
  return;
}

Assistant:

void addChunk() {
			pool.push_back(std::vector<REGION_TYPE>(chunkSize));
			chunkPos++;
			regionPos = 0;
		}